

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O0

void hydro_kx_aead_init(uint8_t *aead_state,uint8_t *k,hydro_kx_state *state)

{
  undefined8 in_RDX;
  uint8_t *in_RSI;
  uint8_t (*in_RDI) [8];
  hydro_hash_state *in_stack_00000018;
  uint8_t tag;
  
  tag = (uint8_t)((ulong)in_RDX >> 0x38);
  hydro_hash_final(in_stack_00000018,aead_state,(size_t)k);
  mem_zero(in_RDI + 1,0x28);
  *in_RDI = (uint8_t  [8])0x36353278786b06;
  gimli_core_u8(in_RSI,tag);
  mem_xor(in_RDI,in_RSI,0x10);
  gimli_core_u8(in_RSI,tag);
  mem_xor(in_RDI,in_RSI + 0x10,0x10);
  gimli_core_u8(in_RSI,tag);
  return;
}

Assistant:

static void
hydro_kx_aead_init(uint8_t aead_state[gimli_BLOCKBYTES], uint8_t k[hydro_kx_AEAD_KEYBYTES],
                   hydro_kx_state *state)
{
    static const uint8_t prefix[] = { 6, 'k', 'x', 'x', '2', '5', '6', 0 };

    hydro_hash_final(&state->h_st, k, hydro_kx_AEAD_KEYBYTES);

    mem_zero(aead_state + sizeof prefix, gimli_BLOCKBYTES - sizeof prefix);
    memcpy(aead_state, prefix, sizeof prefix);
    gimli_core_u8(aead_state, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_kx_AEAD_KEYBYTES == 2 * gimli_RATE);
    mem_xor(aead_state, k, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
    mem_xor(aead_state, k + gimli_RATE, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
}